

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void add_new_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  uint uVar1;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  DLIST_bb_t_append(&gen_ctx->curr_cfg->bbs,bb);
  uVar1 = gen_ctx->curr_bb_index;
  gen_ctx->curr_bb_index = uVar1 + 1;
  bb->index = (ulong)uVar1;
  return;
}

Assistant:

static void add_new_bb (gen_ctx_t gen_ctx, bb_t bb) {
  DLIST_APPEND (bb_t, curr_cfg->bbs, bb);
  bb->index = curr_bb_index++;
}